

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall gl4cts::BasicUsageGS::Run(BasicUsageGS *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  void *pvVar3;
  long lVar4;
  undefined1 in_stack_fffffffffffffeb8;
  GLint p2;
  GLint p1;
  char *xfb_var [2];
  GLuint data [32];
  uint array_buffer_data [32];
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92cf,&p1);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d5,&p2);
  lVar4 = 0;
  if ((0 < p1) && (1 < p2)) {
    GVar2 = gl4cts::anon_unknown_0::SACSubcaseBase::CreateProgram
                      (&this->super_SACSubcaseBase,
                       "#version 420 core\nlayout(location = 0) in uint i_zero;\nout uint vs_zero;\nvoid main() {\n  vs_zero = i_zero;\n}"
                       ,(char *)0x0,
                       "#version 420 core\nlayout(points) in;\nin uint vs_zero[];\nlayout(points, max_vertices = 1) out;\nout uint o_atomic_inc;\nout uint o_atomic_dec;\nlayout(binding = 0, offset = 8) uniform atomic_uint ac_counter_inc;\nlayout(binding = 0, offset = 16) uniform atomic_uint ac_counter_dec;\nvoid main() {\n  o_atomic_inc = vs_zero[0] + atomicCounterIncrement(ac_counter_inc);\n  o_atomic_dec = vs_zero[0] + atomicCounterDecrement(ac_counter_dec);\n  EmitVertex();\n}"
                       ,(char *)0x0,(char *)0x0,(bool)in_stack_fffffffffffffeb8);
    this->prog_ = GVar2;
    xfb_var[0] = "o_atomic_inc";
    xfb_var[1] = "o_atomic_dec";
    glu::CallLogWrapper::glTransformFeedbackVaryings(this_00,GVar2,2,xfb_var,0x8c8d);
    gl4cts::anon_unknown_0::SACSubcaseBase::LinkProgram(&this->super_SACSubcaseBase,this->prog_);
    array_buffer_data[0x1c] = 0;
    array_buffer_data[0x1d] = 0;
    array_buffer_data[0x1e] = 0;
    array_buffer_data[0x1f] = 0;
    array_buffer_data[0x18] = 0;
    array_buffer_data[0x19] = 0;
    array_buffer_data[0x1a] = 0;
    array_buffer_data[0x1b] = 0;
    array_buffer_data[0x14] = 0;
    array_buffer_data[0x15] = 0;
    array_buffer_data[0x16] = 0;
    array_buffer_data[0x17] = 0;
    array_buffer_data[0x10] = 0;
    array_buffer_data[0x11] = 0;
    array_buffer_data[0x12] = 0;
    array_buffer_data[0x13] = 0;
    array_buffer_data[0xc] = 0;
    array_buffer_data[0xd] = 0;
    array_buffer_data[0xe] = 0;
    array_buffer_data[0xf] = 0;
    array_buffer_data[8] = 0;
    array_buffer_data[9] = 0;
    array_buffer_data[10] = 0;
    array_buffer_data[0xb] = 0;
    array_buffer_data[4] = 0;
    array_buffer_data[5] = 0;
    array_buffer_data[6] = 0;
    array_buffer_data[7] = 0;
    array_buffer_data[0] = 0;
    array_buffer_data[1] = 0;
    array_buffer_data[2] = 0;
    array_buffer_data[3] = 0;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->array_buffer_);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->array_buffer_);
    glu::CallLogWrapper::glBufferData(this_00,0x8892,0x80,array_buffer_data,0x88e4);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->counter_buffer_);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->counter_buffer_);
    glu::CallLogWrapper::glBufferData(this_00,0x92c0,0x20,(void *)0x0,0x88ea);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    glu::CallLogWrapper::glGenBuffers(this_00,2,this->xfb_buffer_);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->xfb_buffer_[0]);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,1000,(void *)0x0,0x88e2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->xfb_buffer_[1]);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,1000,(void *)0x0,0x88e2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,0);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->vao_);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->vao_);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->array_buffer_);
    glu::CallLogWrapper::glVertexAttribIPointer(this_00,0,1,0x1405,0,(void *)0x0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    glu::CallLogWrapper::glBindVertexArray(this_00,0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->counter_buffer_);
    pvVar3 = glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,0x20,10);
    *(undefined4 *)((long)pvVar3 + 8) = 0x11;
    *(undefined4 *)((long)pvVar3 + 0x10) = 100;
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
    glu::CallLogWrapper::glEnable(this_00,0x8c89);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,this->counter_buffer_);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,this->xfb_buffer_[0]);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,1,this->xfb_buffer_[1]);
    glu::CallLogWrapper::glUseProgram(this_00,this->prog_);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->vao_);
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
    glu::CallLogWrapper::glDrawArrays(this_00,0,0,0x20);
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    glu::CallLogWrapper::glDisable(this_00,0x8c89);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->xfb_buffer_[0]);
    GVar2 = 0x80;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0,0x80,data);
    bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      ((SACSubcaseBase *)0x20,(GLuint)data,(GLuint *)0x11,GVar2);
    lVar4 = -1;
    if (bVar1) {
      glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->xfb_buffer_[1]);
      GVar2 = 0x80;
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0,0x80,data);
      bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                        ((SACSubcaseBase *)0x20,(GLuint)data,(GLuint *)0x44,GVar2);
      if (bVar1) {
        bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                          (&this->super_SACSubcaseBase,this->counter_buffer_,8,0x31);
        if (bVar1) {
          bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                            (&this->super_SACSubcaseBase,this->counter_buffer_,0x10,0x44);
          lVar4 = (ulong)bVar1 - 1;
        }
      }
    }
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{

		GLint p1, p2;
		glGetIntegerv(GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS, &p1);
		glGetIntegerv(GL_MAX_GEOMETRY_ATOMIC_COUNTERS, &p2);
		if (p1 < 1 || p2 < 2)
		{
			return NO_ERROR;
		}

		// create program
		const char* glsl_vs = "#version 420 core" NL "layout(location = 0) in uint i_zero;" NL "out uint vs_zero;" NL
							  "void main() {" NL "  vs_zero = i_zero;" NL "}";
		const char* glsl_gs =
			"#version 420 core" NL "layout(points) in;" NL "in uint vs_zero[];" NL
			"layout(points, max_vertices = 1) out;" NL "out uint o_atomic_inc;" NL "out uint o_atomic_dec;" NL
			"layout(binding = 0, offset = 8) uniform atomic_uint ac_counter_inc;" NL
			"layout(binding = 0, offset = 16) uniform atomic_uint ac_counter_dec;" NL "void main() {" NL
			"  o_atomic_inc = vs_zero[0] + atomicCounterIncrement(ac_counter_inc);" NL
			"  o_atomic_dec = vs_zero[0] + atomicCounterDecrement(ac_counter_dec);" NL "  EmitVertex();" NL "}";
		prog_				   = CreateProgram(glsl_vs, NULL, NULL, glsl_gs, NULL, false);
		const char* xfb_var[2] = { "o_atomic_inc", "o_atomic_dec" };
		glTransformFeedbackVaryings(prog_, 2, xfb_var, GL_SEPARATE_ATTRIBS);
		LinkProgram(prog_);

		// create array buffer
		const unsigned int array_buffer_data[32] = { 0 };
		glGenBuffers(1, &array_buffer_);
		glBindBuffer(GL_ARRAY_BUFFER, array_buffer_);
		glBufferData(GL_ARRAY_BUFFER, sizeof(array_buffer_data), array_buffer_data, GL_STATIC_DRAW);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		// create atomic counter buffer
		glGenBuffers(1, &counter_buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 32, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// create transform feedback buffers
		glGenBuffers(2, xfb_buffer_);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[0]);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 1000, NULL, GL_STREAM_COPY);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[1]);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 1000, NULL, GL_STREAM_COPY);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		// create vertex array object
		glGenVertexArrays(1, &vao_);
		glBindVertexArray(vao_);
		glBindBuffer(GL_ARRAY_BUFFER, array_buffer_);
		glVertexAttribIPointer(0, 1, GL_UNSIGNED_INT, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		// init counter buffer
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		unsigned int* ptr = static_cast<unsigned int*>(
			glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 32, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT));
		*(ptr + 2) = 17;
		*(ptr + 4) = 100;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		// draw
		glEnable(GL_RASTERIZER_DISCARD);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, xfb_buffer_[0]);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1, xfb_buffer_[1]);
		glUseProgram(prog_);
		glBindVertexArray(vao_);
		glBeginTransformFeedback(GL_POINTS);
		glDrawArrays(GL_POINTS, 0, 32);
		glEndTransformFeedback();
		glDisable(GL_RASTERIZER_DISCARD);

		// validate
		GLuint data[32];
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[0]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(data), data);
		if (!CheckCounterValues(32, data, 17))
			return ERROR;

		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[1]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(data), data);
		if (!CheckCounterValues(32, data, 68))
			return ERROR;

		if (!CheckFinalCounterValue(counter_buffer_, 8, 49))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 16, 68))
			return ERROR;

		return NO_ERROR;
	}